

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  uchar *puVar2;
  Display *pDVar3;
  PFN_XChangeProperty p_Var4;
  size_t sVar5;
  Atom AVar6;
  Window WVar7;
  Atom AVar8;
  ulong uVar9;
  Atom *pAVar10;
  int iVar11;
  uchar *local_158;
  uchar *local_150;
  ulong local_148;
  Atom local_140;
  XEvent *local_138;
  int actualFormat;
  unsigned_long local_128;
  unsigned_long itemCount;
  Atom targets [4];
  XEvent local_f0;
  
  AVar8 = 0;
  memset(&local_f0,0,0xc0);
  p_Var4 = _glfw.x11.xlib.ChangeProperty;
  AVar6 = _glfw.x11.UTF8_STRING;
  pDVar3 = _glfw.x11.display;
  local_f0.type = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_0014825b;
  AVar8 = (event->xselectionrequest).target;
  if (AVar8 == _glfw.x11.TARGETS) {
    pAVar10 = targets;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = 0x1f;
    WVar7 = (event->xkey).root;
    iVar11 = 4;
    AVar6 = 4;
    targets[0] = AVar8;
LAB_001480f0:
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,WVar7,AVar1,AVar6,0x20,0,(uchar *)pAVar10,iVar11);
  }
  else {
    puVar2 = *(uchar **)
              ((long)_glfw.x11.keynames +
              (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    local_150 = puVar2;
    if (AVar8 != _glfw.x11.MULTIPLE) {
      if (AVar8 != _glfw.x11.SAVE_TARGETS) {
        if (AVar8 == 0x1f || AVar8 == _glfw.x11.UTF8_STRING) {
          WVar7 = (event->xkey).root;
          sVar5 = strlen((char *)puVar2);
          (*p_Var4)(pDVar3,WVar7,AVar1,AVar8,8,0,puVar2,(int)sVar5);
          AVar8 = (event->xselectionrequest).property;
        }
        else {
          AVar8 = 0;
        }
        goto LAB_0014825b;
      }
      WVar7 = (event->xkey).root;
      iVar11 = 0;
      pAVar10 = (Atom *)0x0;
      AVar6 = _glfw.x11.NULL_;
      goto LAB_001480f0;
    }
    (*_glfw.x11.xlib.GetWindowProperty)
              (_glfw.x11.display,(event->xkey).root,AVar1,0,0x7fffffffffffffff,0,_glfw.x11.ATOM_PAIR
               ,targets,&actualFormat,&itemCount,&local_128,&local_158);
    if (itemCount != 0) {
      uVar9 = 0;
      local_140 = AVar6;
      local_148 = itemCount;
      local_138 = event;
      do {
        puVar2 = local_150;
        p_Var4 = _glfw.x11.xlib.ChangeProperty;
        pDVar3 = _glfw.x11.display;
        AVar1 = *(Atom *)(local_158 + uVar9 * 8);
        if (AVar1 == 0x1f || AVar1 == AVar6) {
          WVar7 = (event->xkey).root;
          AVar8 = *(Atom *)(local_158 + uVar9 * 8 + 8);
          sVar5 = strlen((char *)local_150);
          event = local_138;
          AVar6 = local_140;
          (*p_Var4)(pDVar3,WVar7,AVar8,AVar1,8,0,puVar2,(int)sVar5);
          itemCount = local_148;
        }
        else {
          puVar2 = local_158 + uVar9 * 8 + 8;
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = '\0';
          puVar2[5] = '\0';
          puVar2[6] = '\0';
          puVar2[7] = '\0';
        }
        uVar9 = uVar9 + 2;
      } while (uVar9 < itemCount);
    }
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
               _glfw.x11.ATOM_PAIR,0x20,0,local_158,(int)itemCount);
    (*_glfw.x11.xlib.Free)(local_158);
  }
  AVar8 = (event->xselectionrequest).property;
LAB_0014825b:
  local_f0.xany.display = (event->xany).display;
  local_f0.xany.window = (event->xkey).root;
  local_f0.xkey.root = (event->xkey).subwindow;
  local_f0.xkey.subwindow = (event->xkey).time;
  local_f0.xselectionrequest.property = (event->xconfigure).above;
  local_f0.xkey.time = AVar8;
  (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,(event->xkey).root,0,0,&local_f0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}